

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::Reflection::UnsafeArenaSetAllocatedMessage
          (Reflection *this,Message *message,Message *sub_message,FieldDescriptor *field)

{
  uint *puVar1;
  uint uVar2;
  int number;
  uint uVar3;
  long *plVar4;
  byte bVar5;
  uint32 uVar6;
  ulong uVar7;
  FieldDescriptor *local_38;
  _func_void_FieldDescriptor_ptr *local_30;
  
  if (*(Descriptor **)(field + 0x50) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"SetAllocatedMessage","Field does not match message type.");
  }
  if (*(int *)(field + 0x3c) == 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"SetAllocatedMessage",
               "Field is repeated; the method requires a singular field.");
  }
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_30 = FieldDescriptor::TypeOnceInit;
    local_38 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),&local_30,&local_38);
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) != 10) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"SetAllocatedMessage",CPPTYPE_MESSAGE);
  }
  if (field[0x42] == (FieldDescriptor)0x1) {
    uVar2 = (this->schema_).extensions_offset_;
    number = *(int *)(field + 0x44);
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_30 = FieldDescriptor::TypeOnceInit;
      local_38 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),&local_30,&local_38);
    }
    internal::ExtensionSet::UnsafeArenaSetAllocatedMessage
              ((ExtensionSet *)
               ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2),number,
               (FieldType)field[0x38],field,&sub_message->super_MessageLite);
  }
  else if (*(OneofDescriptor **)(field + 0x58) == (OneofDescriptor *)0x0) {
    uVar2 = (this->schema_).has_bits_offset_;
    if (sub_message == (Message *)0x0) {
      if (uVar2 != 0xffffffff) {
        uVar3 = (this->schema_).has_bit_indices_
                [(int)((ulong)((long)field - *(long *)(*(long *)(field + 0x50) + 0x28)) >> 3) *
                 0x286bca1b];
        bVar5 = (byte)uVar3 & 0x1f;
        puVar1 = (uint *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                         (ulong)(uVar3 >> 5) * 4 + (ulong)uVar2);
        *puVar1 = *puVar1 & (-2 << bVar5 | 0xfffffffeU >> 0x20 - bVar5);
      }
    }
    else if (uVar2 != 0xffffffff) {
      uVar3 = (this->schema_).has_bit_indices_
              [(int)((ulong)((long)field - *(long *)(*(long *)(field + 0x50) + 0x28)) >> 3) *
               0x286bca1b];
      puVar1 = (uint *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                       (ulong)(uVar3 >> 5) * 4 + (ulong)uVar2);
      *puVar1 = *puVar1 | 1 << ((byte)uVar3 & 0x1f);
    }
    uVar6 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    uVar7 = *(ulong *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                      (ulong)(uint)(this->schema_).metadata_offset_);
    if ((uVar7 & 1) != 0) {
      uVar7 = *(ulong *)((uVar7 & 0xfffffffffffffffe) + 0x18);
    }
    if ((uVar7 == 0) &&
       (plVar4 = *(long **)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar6),
       plVar4 != (long *)0x0)) {
      (**(code **)(*plVar4 + 8))();
    }
    *(Message **)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar6) =
         sub_message;
  }
  else {
    ClearOneof(this,message,*(OneofDescriptor **)(field + 0x58));
    if (sub_message != (Message *)0x0) {
      uVar6 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      *(Message **)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar6) =
           sub_message;
      *(undefined4 *)
       ((long)&(message->super_MessageLite)._vptr_MessageLite +
       (ulong)(uint)((int)((ulong)(*(long *)(field + 0x58) -
                                  *(long *)(*(long *)(*(long *)(field + 0x58) + 0x10) + 0x30)) >> 4)
                     * -0x55555554 + (this->schema_).oneof_case_offset_)) =
           *(undefined4 *)(field + 0x44);
    }
  }
  return;
}

Assistant:

void Reflection::UnsafeArenaSetAllocatedMessage(
    Message* message, Message* sub_message,
    const FieldDescriptor* field) const {
  USAGE_CHECK_ALL(SetAllocatedMessage, SINGULAR, MESSAGE);

  if (field->is_extension()) {
    MutableExtensionSet(message)->UnsafeArenaSetAllocatedMessage(
        field->number(), field->type(), field, sub_message);
  } else {
    if (field->containing_oneof()) {
      if (sub_message == nullptr) {
        ClearOneof(message, field->containing_oneof());
        return;
      }
        ClearOneof(message, field->containing_oneof());
        *MutableRaw<Message*>(message, field) = sub_message;
      SetOneofCase(message, field);
      return;
    }

    if (sub_message == nullptr) {
      ClearBit(message, field);
    } else {
      SetBit(message, field);
    }
    Message** sub_message_holder = MutableRaw<Message*>(message, field);
    if (GetArena(message) == nullptr) {
      delete *sub_message_holder;
    }
    *sub_message_holder = sub_message;
  }
}